

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.hpp
# Opt level: O1

void __thiscall SingletonDatabase::SingletonDatabase(SingletonDatabase *this)

{
  int iVar1;
  char *__nptr;
  char cVar2;
  char cVar3;
  istream *piVar4;
  int *piVar5;
  ulonglong uVar6;
  mapped_type *pmVar7;
  undefined8 uVar8;
  string num;
  string name;
  ifstream in;
  char *local_280;
  undefined8 local_278;
  char local_270;
  undefined7 uStack_26f;
  key_type local_260;
  char *local_240;
  long local_238 [65];
  
  (this->super_IDatabase)._vptr_IDatabase = (_func_int **)&PTR_get_population_00104d70;
  (this->data)._M_h._M_buckets = &(this->data)._M_h._M_single_bucket;
  (this->data)._M_h._M_bucket_count = 1;
  (this->data)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->data)._M_h._M_element_count = 0;
  (this->data)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->data)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->data)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"SingletonDatabase::SingletonDatabase()",0x26);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::ifstream::ifstream((istream *)local_238,"resource.txt",_S_in);
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  local_260._M_string_length = 0;
  local_260.field_2._M_local_buf[0] = '\0';
  local_280 = &local_270;
  local_278 = 0;
  local_270 = '\0';
  while( true ) {
    do {
      cVar3 = (char)(istream *)local_238;
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar3);
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_260,cVar2);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
        if (local_280 != &local_270) {
          operator_delete(local_280,CONCAT71(uStack_26f,local_270) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,
                          CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                   local_260.field_2._M_local_buf[0]) + 1);
        }
        std::ifstream::~ifstream(local_238);
        return;
      }
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar3);
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_280,cVar3);
      __nptr = local_280;
    } while (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0);
    piVar5 = __errno_location();
    iVar1 = *piVar5;
    *piVar5 = 0;
    uVar6 = strtoull(__nptr,&local_240,10);
    if (local_240 == __nptr) break;
    if (*piVar5 == 0) {
      *piVar5 = iVar1;
    }
    else if (*piVar5 == 0x22) goto LAB_001026f1;
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->data,&local_260);
    *pmVar7 = uVar6;
  }
  std::__throw_invalid_argument("stoull");
LAB_001026f1:
  uVar8 = std::__throw_out_of_range("stoull");
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->data)._M_h);
  _Unwind_Resume(uVar8);
}

Assistant:

SingletonDatabase()
	{
		std::clog << "SingletonDatabase::SingletonDatabase()" << std::endl;

		std::ifstream in("resource.txt");
		std::string name, num;
		while(std::getline(in, name))
		{
			if(std::getline(in, num))
			{
				data[name] = std::stoull(num);
			}
		}
	}